

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.cc
# Opt level: O0

uint8_t * __thiscall
google::protobuf::io::EpsCopyOutputStream::GetDirectBufferForNBytesAndAdvance
          (EpsCopyOutputStream *this,int size,uint8_t **pp)

{
  int size_00;
  uint8_t *puVar1;
  uint8_t *res;
  int s;
  uint8_t **pp_local;
  int size_local;
  EpsCopyOutputStream *this_local;
  
  if ((this->had_error_ & 1U) == 0) {
    size_00 = Flush(this,*pp);
    if ((this->had_error_ & 1U) == 0) {
      if (size_00 < size) {
        puVar1 = SetInitialBuffer(this,this->buffer_end_,size_00);
        *pp = puVar1;
        this_local = (EpsCopyOutputStream *)0x0;
      }
      else {
        this_local = (EpsCopyOutputStream *)this->buffer_end_;
        puVar1 = SetInitialBuffer(this,this->buffer_end_ + size,size_00 - size);
        *pp = puVar1;
      }
    }
    else {
      *pp = this->buffer_;
      this_local = (EpsCopyOutputStream *)0x0;
    }
  }
  else {
    *pp = this->buffer_;
    this_local = (EpsCopyOutputStream *)0x0;
  }
  return (uint8_t *)this_local;
}

Assistant:

uint8_t* EpsCopyOutputStream::GetDirectBufferForNBytesAndAdvance(int size,
                                                               uint8_t** pp) {
  if (had_error_) {
    *pp = buffer_;
    return nullptr;
  }
  int s = Flush(*pp);
  if (had_error_) {
    *pp = buffer_;
    return nullptr;
  }
  if (s >= size) {
    auto res = buffer_end_;
    *pp = SetInitialBuffer(buffer_end_ + size, s - size);
    return res;
  } else {
    *pp = SetInitialBuffer(buffer_end_, s);
    return nullptr;
  }
}